

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O0

void png_read_update_info(png_structrp png_ptr,png_inforp info_ptr)

{
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  if (png_ptr != (png_structrp)0x0) {
    if ((png_ptr->flags & 0x40) == 0) {
      png_read_start_row(png_ptr);
      png_read_transform_info(png_ptr,info_ptr);
    }
    else {
      png_app_error(png_ptr,"png_read_update_info/png_start_read_image: duplicate call");
    }
  }
  return;
}

Assistant:

void PNGAPI
png_read_update_info(png_structrp png_ptr, png_inforp info_ptr)
{
   png_debug(1, "in png_read_update_info");

   if (png_ptr != NULL)
   {
      if ((png_ptr->flags & PNG_FLAG_ROW_INIT) == 0)
      {
         png_read_start_row(png_ptr);

#        ifdef PNG_READ_TRANSFORMS_SUPPORTED
            png_read_transform_info(png_ptr, info_ptr);
#        else
            PNG_UNUSED(info_ptr)
#        endif
      }

      /* New in 1.6.0 this avoids the bug of doing the initializations twice */
      else
         png_app_error(png_ptr,
             "png_read_update_info/png_start_read_image: duplicate call");
   }
}